

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O1

int lejp_parser_push(lejp_ctx *ctx,void *user,char **paths,uchar paths_count,lejp_callback lejp_cb)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = -1;
  if (ctx->pst_sp != '\x04') {
    lejp_check_path_match(ctx);
    bVar1 = ctx->pst_sp + 1;
    ctx->pst[ctx->pst_sp].path_match = ctx->path_match;
    ctx->pst_sp = bVar1;
    ctx->pst[bVar1].user = user;
    ctx->pst[bVar1].callback = lejp_cb;
    ctx->pst[bVar1].paths = paths;
    ctx->pst[bVar1].count_paths = paths_count;
    iVar2 = 0;
    ctx->pst[bVar1].ppos = '\0';
    ctx->path_match = '\0';
    lejp_check_path_match(ctx);
    _lws_log(0x10,"%s: pushed parser stack to %d (path %s)\n","lejp_parser_push",(ulong)ctx->pst_sp,
             ctx->path);
  }
  return iVar2;
}

Assistant:

int
lejp_parser_push(struct lejp_ctx *ctx, void *user, const char * const *paths,
		 unsigned char paths_count, lejp_callback lejp_cb)
{
	struct _lejp_parsing_stack *p;

	if (ctx->pst_sp + 1 == LEJP_MAX_PARSING_STACK_DEPTH)
		return -1;

	lejp_check_path_match(ctx);

	ctx->pst[ctx->pst_sp].path_match = ctx->path_match;
	ctx->pst_sp++;

	p = &ctx->pst[ctx->pst_sp];
	p->user = user;
	p->callback = lejp_cb;
	p->paths = paths;
	p->count_paths = paths_count;
	p->ppos = 0;

	ctx->path_match = 0;
	lejp_check_path_match(ctx);

	lwsl_debug("%s: pushed parser stack to %d (path %s)\n", __func__,
		   ctx->pst_sp, ctx->path);

	return 0;
}